

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.cc
# Opt level: O3

double lf::fe::Jacobi(uint n,double alpha,double beta,double x)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (n == 0) {
    dVar4 = 1.0;
  }
  else {
    dVar3 = x + x + -1.0;
    if (n == 1) {
      dVar4 = (dVar3 * (alpha + beta + 2.0) + (alpha - beta)) * 0.5;
    }
    else {
      iVar2 = n - 1;
      uVar1 = 4;
      dVar7 = 1.0;
      dVar4 = ((alpha + beta + 2.0) * dVar3 + (alpha - beta)) * 0.5;
      dVar6 = 1.0;
      do {
        dVar5 = dVar4;
        dVar8 = dVar7 + alpha;
        dVar9 = (double)(uVar1 - 2) + alpha + beta;
        dVar4 = dVar7 + beta;
        dVar7 = dVar7 + 1.0;
        dVar4 = (((dVar9 + 1.0) * dVar9 * (dVar9 + 2.0) * dVar3 +
                 (alpha * alpha - beta * beta) * (dVar9 + 1.0)) * dVar5 +
                dVar8 * -2.0 * dVar4 * (dVar9 + 2.0) * dVar6) *
                (1.0 / ((dVar8 + beta + 1.0) * (double)uVar1 * dVar9));
        uVar1 = uVar1 + 2;
        iVar2 = iVar2 + -1;
        dVar6 = dVar5;
      } while (iVar2 != 0);
    }
  }
  return dVar4;
}

Assistant:

double Jacobi(unsigned n, double alpha, double beta, double x) {
  // The recurrence relation is for the non-shifted Jacobi Polynomials
  // We thus map [0, 1] onto [-1, 1]
  x = 2 * x - 1;
  if (n == 0) {
    return 1;
  }
  if (n == 1) {
    return 0.5 * (alpha - beta + x * (alpha + beta + 2));
  }
  double p0 = 1;
  double p1 = 0.5 * (alpha - beta + x * (alpha + beta + 2));
  double p2 = 0;
  for (unsigned j = 1; j < n; ++j) {
    const double alpha1 =
        2 * (j + 1) * (j + alpha + beta + 1) * (2 * j + alpha + beta);
    const double alpha2 =
        (2 * j + alpha + beta + 1) * (alpha * alpha - beta * beta);
    const double alpha3 = (2 * j + alpha + beta) * (2 * j + alpha + beta + 1) *
                          (2 * j + alpha + beta + 2);
    const double alpha4 =
        2 * (j + alpha) * (j + beta) * (2 * j + alpha + beta + 2);
    p2 = 1. / alpha1 * ((alpha2 + alpha3 * x) * p1 - alpha4 * p0);
    p0 = p1;
    p1 = p2;
  }
  return p2;
}